

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> * __thiscall
kj::ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::operator=
          (ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this,
          ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *other)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar3;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    pRVar2 = this->pos;
    pMVar3 = this->endPtr;
    this->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    this->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    this->endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,
               (long)pMVar3 - (long)pMVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  other->pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  other->endPtr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }